

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator>>(int lhs,SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   bits)

{
  char cVar1;
  undefined4 in_EDI;
  int in_stack_fffffffffffffff0;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_4;
  
  cVar1 = SafeInt::operator_cast_to_char
                    ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(in_EDI,in_stack_fffffffffffffff0));
  if (cVar1 < '\0') {
    __assert_fail("!std::numeric_limits< T >::is_signed || (T)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x1b13,
                  "SafeInt<U, E> operator>>(U, SafeInt<T, E>) [T = char, U = int, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>]"
                 );
  }
  cVar1 = SafeInt::operator_cast_to_char
                    ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(in_EDI,in_stack_fffffffffffffff0));
  if (cVar1 < ' ') {
    SafeInt::operator_cast_to_char
              ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT44(in_EDI,in_stack_fffffffffffffff0));
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_4,(int *)&stack0xfffffffffffffff0);
    return (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
           local_4.m_int;
  }
  __assert_fail("(T)bits < (int)safeint_internal::int_traits< U >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x1b14,
                "SafeInt<U, E> operator>>(U, SafeInt<T, E>) [T = char, U = int, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< U, E > operator >>( U lhs, SafeInt< T, E > bits ) SAFEINT_NOTHROW
{
    ShiftAssert( !std::numeric_limits< T >::is_signed || (T)bits >= 0 );
    ShiftAssert( (T)bits < (int)safeint_internal::int_traits< U >::bitCount );

    return SafeInt< U, E >( (U)( lhs >> (T)bits ) );
}